

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper_functions.h
# Opt level: O3

void print_test_failed<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *rhs)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test failed. ",0xd);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(lhs->_M_dataplus)._M_p,lhs->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," != ",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(rhs->_M_dataplus)._M_p,rhs->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void print_test_failed(const T& lhs, const T& rhs)
{
#if WIN32
	HANDLE console = GetStdHandle(STD_OUTPUT_HANDLE);
	CONSOLE_SCREEN_BUFFER_INFO info;
	GetConsoleScreenBufferInfo(console, &info);
	SetConsoleTextAttribute(console, FOREGROUND_RED);
#endif
	std::cout << "Test failed. " << lhs << " != " << rhs << std::endl;
#if WIN32
	SetConsoleTextAttribute(console, info.wAttributes);
#endif

}